

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O3

void stbir__calculate_filters
               (stbir__contributors *contributors,float *coefficients,stbir_filter filter,
               float scale_ratio,float shift,int input_size,int output_size)

{
  int iVar1;
  stbir__support_fn *psVar2;
  stbir__kernel_fn *psVar3;
  bool bVar4;
  float *pfVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  double dVar18;
  double dVar19;
  stbir__contributors sVar20;
  float fVar16;
  float fVar17;
  stbir__contributors sVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float in_XMM2_Db;
  
  if (1.0 < scale_ratio) {
    psVar2 = stbir__filter_info_table[filter].support;
    fVar25 = 1.0 / scale_ratio;
    fVar15 = (*psVar2)(fVar25);
    if (0 < output_size) {
      uVar13 = 0;
      do {
        fVar24 = (float)(int)uVar13 + 0.5;
        auVar22._0_4_ = (fVar24 - fVar15 * scale_ratio) + shift;
        auVar22._4_4_ = fVar15 * scale_ratio + fVar24 + shift;
        auVar22._8_4_ = in_XMM2_Db + shift;
        auVar22._12_4_ = shift + 0.0;
        auVar23._4_4_ = scale_ratio;
        auVar23._0_4_ = scale_ratio;
        auVar23._8_4_ = scale_ratio;
        auVar23._12_4_ = scale_ratio;
        auVar23 = divps(auVar22,auVar23);
        dVar18 = floor((double)auVar23._0_4_ + 0.5);
        dVar19 = floor((double)auVar23._4_4_ + -0.5);
        sVar21.n0 = (int)dVar18;
        sVar21.n1 = (int)dVar19;
        fVar16 = (*psVar2)(fVar25);
        fVar16 = ceilf(fVar16 + fVar16);
        uVar7 = sVar21.n1 - sVar21.n0;
        fVar17 = (*psVar2)(fVar25);
        fVar17 = ceilf(fVar17 + fVar17);
        if ((int)fVar17 < (int)uVar7) {
          __assert_fail("in_last_pixel - in_first_pixel <= (int)ceil(stbir__filter_info_table[filter].support(1/scale) * 2)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x414,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        contributors[uVar13] = sVar21;
        if (sVar21.n1 < sVar21.n0) {
          __assert_fail("contributor->n1 >= contributor->n0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x419,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        fVar17 = (fVar24 + shift) / scale_ratio;
        iVar12 = (int)fVar16 * (int)uVar13;
        psVar3 = stbir__filter_info_table[filter].kernel;
        if ((int)uVar7 < 0) {
          fVar16 = 0.0;
        }
        else {
          fVar16 = 0.0;
          iVar10 = 0;
          do {
            fVar24 = (*psVar3)(fVar17 - ((float)(sVar21.n0 + iVar10) + 0.5),fVar25);
            coefficients[(long)iVar12 + (long)iVar10] = fVar24;
            if (((iVar10 != 0) || (fVar24 != 0.0)) || (NAN(fVar24))) {
              fVar16 = fVar16 + fVar24;
              iVar10 = iVar10 + 1;
            }
            else {
              sVar21.n0 = sVar21.n0 + 1;
              contributors[uVar13].n0 = sVar21.n0;
              iVar10 = 0;
            }
            uVar7 = sVar21.n1 - sVar21.n0;
          } while (iVar10 <= (int)uVar7);
        }
        fVar17 = (*psVar3)(((float)(sVar21.n1 + 1) + 0.5) - fVar17,fVar25);
        if ((fVar17 != 0.0) || (NAN(fVar17))) {
          __assert_fail("stbir__filter_info_table[filter].kernel((float)(in_last_pixel + 1) + 0.5f - in_center_of_out, 1/scale) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x42b,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (fVar16 <= 0.9) {
          __assert_fail("total_filter > 0.9",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x42d,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (1.1 <= fVar16) {
          __assert_fail("total_filter < 1.1f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x42e,
                        "void stbir__calculate_coefficients_upsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (-1 < (int)uVar7) {
          uVar14 = 0;
          do {
            coefficients[(long)iVar12 + uVar14] =
                 coefficients[(long)iVar12 + uVar14] * (1.0 / fVar16);
            uVar14 = uVar14 + 1;
          } while (uVar7 + 1 != uVar14);
          uVar14 = (ulong)uVar7;
          do {
            if ((coefficients[(long)iVar12 + uVar14] != 0.0) ||
               (NAN(coefficients[(long)iVar12 + uVar14]))) break;
            contributors[uVar13].n1 = contributors[uVar13].n0 + (int)(uVar14 - 1);
            bVar4 = 0 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar4);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != (uint)output_size);
    }
  }
  else {
    sVar21.n0 = stbir__get_filter_pixel_width(filter,scale_ratio);
    uVar7 = sVar21.n0 - (sVar21.n0 >> 0x1f) & 0xfffffffe;
    psVar2 = stbir__filter_info_table[filter].support;
    fVar15 = (*psVar2)(scale_ratio);
    uVar8 = uVar7 + input_size;
    if (uVar8 != 0 && SCARRY4(uVar7,input_size) == (int)uVar8 < 0) {
      fVar25 = -shift;
      uVar13 = 0;
      do {
        sVar21.n0 = stbir__get_filter_pixel_width(filter,scale_ratio);
        iVar12 = (int)uVar13;
        fVar24 = (float)(iVar12 - sVar21.n0 / 2) + 0.5;
        dVar18 = floor((double)((fVar24 - fVar15 / scale_ratio) * scale_ratio + fVar25) + 0.5);
        dVar19 = floor((double)((fVar15 / scale_ratio + fVar24) * scale_ratio + fVar25) + -0.5);
        sVar20.n0 = (int)dVar18;
        sVar20.n1 = (int)dVar19;
        fVar16 = (*psVar2)(scale_ratio);
        fVar16 = ceilf(fVar16 + fVar16);
        uVar7 = sVar20.n1 - sVar20.n0;
        fVar17 = (*psVar2)(scale_ratio);
        fVar17 = ceilf(fVar17 + fVar17);
        if ((int)fVar17 < (int)uVar7) {
          __assert_fail("out_last_pixel - out_first_pixel <= (int)ceil(stbir__filter_info_table[filter].support(scale_ratio) * 2)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x444,
                        "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        contributors[uVar13] = sVar20;
        if (sVar20.n1 < sVar20.n0) {
          __assert_fail("contributor->n1 >= contributor->n0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x449,
                        "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        fVar17 = fVar24 * scale_ratio + fVar25;
        psVar3 = stbir__filter_info_table[filter].kernel;
        if (-1 < (int)uVar7) {
          uVar14 = 0;
          do {
            fVar24 = (*psVar3)(((float)((int)uVar14 + sVar20.n0) + 0.5) - fVar17,scale_ratio);
            coefficients[(long)((int)fVar16 * iVar12) + uVar14] = fVar24 * scale_ratio;
            uVar14 = uVar14 + 1;
          } while ((uint)((sVar20.n1 + 1) - sVar20.n0) != uVar14);
        }
        fVar17 = (*psVar3)(((float)(sVar20.n1 + 1) + 0.5) - fVar17,scale_ratio);
        if ((fVar17 != 0.0) || (NAN(fVar17))) {
          __assert_fail("stbir__filter_info_table[filter].kernel((float)(out_last_pixel + 1) + 0.5f - out_center_of_in, scale_ratio) == 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x452,
                        "void stbir__calculate_coefficients_downsample(stbir_filter, float, int, int, float, stbir__contributors *, float *)"
                       );
        }
        if (-1 < (int)uVar7) {
          sVar21.n0 = (sVar20.n1 - sVar20.n0) + 1;
          pfVar5 = coefficients + (long)((int)fVar16 * iVar12) + (ulong)uVar7;
          do {
            if ((*pfVar5 != 0.0) || (NAN(*pfVar5))) break;
            contributors[uVar13].n1 = contributors[uVar13].n0 + sVar21.n0 + -2;
            sVar21.n0 = sVar21.n0 + -1;
            pfVar5 = pfVar5 + -1;
          } while (0 < sVar21.n0);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar8);
    }
    sVar21.n0 = stbir__get_filter_pixel_width(filter,scale_ratio);
    uVar7 = (sVar21.n0 - (sVar21.n0 >> 0x1f) & 0xfffffffeU) + input_size;
    fVar15 = (*psVar2)(scale_ratio);
    fVar15 = ceilf(fVar15 + fVar15);
    uVar13 = (ulong)uVar7;
    if (0 < output_size) {
      if ((int)uVar7 < 1) {
LAB_00137cfa:
        __assert_fail("total > 0.9f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                      ,0x475,
                      "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                     );
      }
      sVar21.n0 = 0;
      do {
        fVar25 = 0.0;
        uVar14 = 0;
        do {
          iVar12 = contributors[uVar14].n0;
          if (sVar21.n0 < iVar12) break;
          if (sVar21.n0 <= contributors[uVar14].n1) {
            fVar16 = (*psVar2)(scale_ratio);
            fVar16 = ceilf(fVar16 + fVar16);
            fVar25 = fVar25 + coefficients[(sVar21.n0 - iVar12) + (int)uVar14 * (int)fVar16];
          }
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
        if (fVar25 <= 0.9) goto LAB_00137cfa;
        if (1.1 <= fVar25) {
          __assert_fail("total < 1.1f",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                        ,0x476,
                        "void stbir__normalize_downsample_coefficients(stbir__contributors *, float *, stbir_filter, float, int, int)"
                       );
        }
        uVar14 = 0;
        do {
          iVar12 = contributors[uVar14].n0;
          if (sVar21.n0 < iVar12) break;
          if (sVar21.n0 <= contributors[uVar14].n1) {
            fVar16 = (*psVar2)(scale_ratio);
            fVar16 = ceilf(fVar16 + fVar16);
            iVar12 = (sVar21.n0 - iVar12) + (int)uVar14 * (int)fVar16;
            coefficients[iVar12] = coefficients[iVar12] * (1.0 / fVar25);
          }
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
        sVar21.n0 = sVar21.n0 + 1;
      } while (sVar21.n0 != output_size);
    }
    if (0 < (int)uVar7) {
      sVar21.n0 = (int)fVar15;
      uVar14 = 0;
      do {
        iVar12 = -1;
        lVar9 = 0;
        do {
          lVar6 = lVar9;
          fVar15 = (*psVar2)(scale_ratio);
          fVar15 = ceilf(fVar15 + fVar15);
          iVar10 = (int)uVar14;
          iVar12 = iVar12 + 1;
          lVar9 = lVar6 + 1;
        } while (coefficients[(int)fVar15 * iVar10 + lVar6] == 0.0);
        iVar1 = contributors[uVar14].n0;
        iVar11 = iVar12 + iVar1;
        if (iVar12 + iVar1 < 1) {
          iVar11 = 0;
        }
        iVar12 = contributors[uVar14].n1;
        contributors[uVar14].n0 = iVar11;
        iVar11 = (iVar12 - iVar11) + 1;
        if (sVar21.n0 < iVar11) {
          iVar11 = sVar21.n0;
        }
        fVar15 = (*psVar2)(scale_ratio);
        fVar15 = ceilf(fVar15 + fVar15);
        if (0 < iVar11) {
          iVar11 = (int)lVar6 + iVar1;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          iVar12 = (iVar12 - iVar11) + 1;
          if (sVar21.n0 < iVar12) {
            iVar12 = sVar21.n0;
          }
          lVar9 = 0;
          do {
            if ((int)fVar15 <= (iVar11 - iVar1) + (int)lVar9) break;
            fVar25 = (*psVar2)(scale_ratio);
            fVar25 = ceilf(fVar25 + fVar25);
            fVar25 = coefficients[(long)((int)fVar25 * iVar10) + (iVar11 - iVar1) + lVar9];
            fVar16 = (*psVar2)(scale_ratio);
            fVar16 = ceilf(fVar16 + fVar16);
            coefficients[(int)fVar16 * iVar10 + lVar9] = fVar25;
            lVar9 = lVar9 + 1;
          } while (iVar12 != (int)lVar9);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13);
      uVar14 = 0;
      do {
        sVar21.n0 = contributors[uVar14].n1;
        if (output_size + -1 <= contributors[uVar14].n1) {
          sVar21.n0 = output_size + -1;
        }
        contributors[uVar14].n1 = sVar21.n0;
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
  }
  return;
}

Assistant:

static void stbir__calculate_filters(stbir__contributors* contributors, float* coefficients, stbir_filter filter, float scale_ratio, float shift, int input_size, int output_size)
{
    int n;
    int total_contributors = stbir__get_contributors(scale_ratio, filter, input_size, output_size);

    if (stbir__use_upsampling(scale_ratio))
    {
        float out_pixels_radius = stbir__filter_info_table[filter].support(1 / scale_ratio) * scale_ratio;

        // Looping through out pixels
        for (n = 0; n < total_contributors; n++)
        {
            float in_center_of_out; // Center of the current out pixel in the in pixel space
            int in_first_pixel, in_last_pixel;

            stbir__calculate_sample_range_upsample(n, out_pixels_radius, scale_ratio, shift, &in_first_pixel, &in_last_pixel, &in_center_of_out);

            stbir__calculate_coefficients_upsample(filter, scale_ratio, in_first_pixel, in_last_pixel, in_center_of_out, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }
    }
    else
    {
        float in_pixels_radius = stbir__filter_info_table[filter].support(scale_ratio) / scale_ratio;

        // Looping through in pixels
        for (n = 0; n < total_contributors; n++)
        {
            float out_center_of_in; // Center of the current out pixel in the in pixel space
            int out_first_pixel, out_last_pixel;
            int n_adjusted = n - stbir__get_filter_pixel_margin(filter, scale_ratio);

            stbir__calculate_sample_range_downsample(n_adjusted, in_pixels_radius, scale_ratio, shift, &out_first_pixel, &out_last_pixel, &out_center_of_in);

            stbir__calculate_coefficients_downsample(filter, scale_ratio, out_first_pixel, out_last_pixel, out_center_of_in, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }

        stbir__normalize_downsample_coefficients(contributors, coefficients, filter, scale_ratio, input_size, output_size);
    }
}